

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_sse.c
# Opt level: O1

parasail_profile_t *
parasail_profile_create_stats_sse_128_32(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  parasail_profile_t *ppVar5;
  ulong uVar6;
  size_t size;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  byte *pbVar18;
  __m128i_32_t p;
  __m128i_32_t s;
  __m128i_32_t m;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  int iVar17;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_profile_create_stats_sse_128_32_cold_2();
  }
  else if (s1 == (char *)0x0) {
    parasail_profile_create_stats_sse_128_32_cold_1();
  }
  else {
    if (matrix->type != 0) {
      _s1Len = matrix->length;
    }
    uVar1 = matrix->size;
    iVar17 = _s1Len + 6;
    if (-1 < _s1Len + 3) {
      iVar17 = _s1Len + 3;
    }
    uVar16 = iVar17 >> 2;
    size = (long)(int)(uVar16 * uVar1) << 4;
    pvVar2 = parasail_memalign(0x10,size);
    if ((((pvVar2 != (void *)0x0) && (pvVar3 = parasail_memalign(0x10,size), pvVar3 != (void *)0x0))
        && (pvVar4 = parasail_memalign(0x10,size), pvVar4 != (void *)0x0)) &&
       (ppVar5 = parasail_profile_new(s1,_s1Len,matrix), ppVar5 != (parasail_profile_t *)0x0)) {
      if (0 < (int)uVar1) {
        uVar6 = 1;
        if (1 < (int)uVar16) {
          uVar6 = (ulong)uVar16;
        }
        uVar7 = 0;
        lVar11 = 0;
        do {
          if (0 < _s1Len) {
            lVar11 = (long)(int)lVar11;
            uVar12 = 0;
            do {
              iVar17 = matrix->type;
              lVar15 = 0;
              uVar14 = uVar12;
              do {
                iVar13 = (int)uVar14;
                if (iVar17 == 0) {
                  if (iVar13 < _s1Len) {
                    pbVar18 = (byte *)(s1 + uVar14);
                    uVar10 = uVar7;
                    goto LAB_0059ffca;
                  }
LAB_0059ffea:
                  iVar8 = 0;
                }
                else {
                  if (_s1Len <= iVar13) goto LAB_0059ffea;
                  pbVar18 = (byte *)(matrix->alphabet + uVar7);
                  uVar10 = uVar14;
LAB_0059ffca:
                  iVar8 = matrix->matrix
                          [(long)(int)((int)uVar10 * uVar1) + (long)matrix->mapper[*pbVar18]];
                }
                *(int *)((long)&local_68 + lVar15 * 4) = iVar8;
                uVar9 = 0;
                if (iVar13 < _s1Len) {
                  uVar9 = (uint)(uVar7 == (uint)matrix->mapper[(byte)s1[uVar14]]);
                }
                *(uint *)((long)&local_48 + lVar15 * 4) = uVar9;
                *(uint *)((long)&local_58 + lVar15 * 4) =
                     (uint)(0 < *(int *)((long)&local_68 + lVar15 * 4));
                uVar14 = uVar14 + uVar16;
                lVar15 = lVar15 + 1;
              } while (lVar15 != 4);
              lVar15 = lVar11 * 0x10;
              *(undefined8 *)((long)pvVar2 + lVar15) = local_68;
              ((undefined8 *)((long)pvVar2 + lVar15))[1] = uStack_60;
              *(undefined8 *)((long)pvVar3 + lVar15) = local_48;
              ((undefined8 *)((long)pvVar3 + lVar15))[1] = uStack_40;
              *(undefined8 *)((long)pvVar4 + lVar15) = local_58;
              ((undefined8 *)((long)pvVar4 + lVar15))[1] = uStack_50;
              lVar11 = lVar11 + 1;
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar6);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar1);
      }
      (ppVar5->profile32).score = pvVar2;
      (ppVar5->profile32).matches = pvVar3;
      (ppVar5->profile32).similar = pvVar4;
      ppVar5->free = parasail_free___m128i;
      return ppVar5;
    }
  }
  return (parasail_profile_t *)0x0;
}

Assistant:

parasail_profile_t * parasail_profile_create_stats_sse_128_32(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0;
    const int32_t segWidth = 4; /* number of values in vector unit */
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is required for both pssm and square */
    PARASAIL_CHECK_NULL(s1);

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size; /* number of amino acids in table */
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m128i(16, n * segLen);
    if (!vProfile) return NULL;
    vProfileM = parasail_memalign___m128i(16, n * segLen);
    if (!vProfileM) return NULL;
    vProfileS = parasail_memalign___m128i(16, n * segLen);
    if (!vProfileS) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m128i_32_t p;
            __m128i_32_t m;
            __m128i_32_t s;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                m.v[segNum] = j >= s1Len ? 0 : (k == matrix->mapper[(unsigned char)s1[j]]);
                s.v[segNum] = p.v[segNum] > 0;
                j += segLen;
            }
            _mm_store_si128(&vProfile[index], p.m);
            _mm_store_si128(&vProfileM[index], m.m);
            _mm_store_si128(&vProfileS[index], s.m);
            ++index;
        }
    }

    profile->profile32.score = vProfile;
    profile->profile32.matches = vProfileM;
    profile->profile32.similar = vProfileS;
    profile->free = &parasail_free___m128i;
    return profile;
}